

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaneMap.h
# Opt level: O1

void __thiscall PlaneMap::PlaneMap(PlaneMap *this,Vector *n,Vector *e1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  (this->super_Map)._vptr_Map = (_func_int **)&PTR__Map_0010b960;
  dVar1 = n->x;
  dVar2 = n->y;
  dVar3 = e1->y;
  dVar4 = n->z;
  dVar5 = e1->z;
  dVar7 = dVar4 * dVar5 + dVar1 * e1->x + dVar2 * dVar3;
  dVar6 = dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2;
  (this->eu).x = e1->x - (dVar1 * dVar7) / dVar6;
  (this->eu).y = dVar3 - (dVar2 * dVar7) / dVar6;
  (this->eu).z = dVar5 - (dVar7 * dVar4) / dVar6;
  dVar1 = n->x;
  dVar2 = n->y;
  dVar3 = e1->z;
  dVar4 = n->z;
  dVar5 = e1->x;
  dVar6 = e1->y;
  (this->ev).x = dVar2 * dVar3 - dVar6 * dVar4;
  (this->ev).y = dVar4 * dVar5 - dVar3 * dVar1;
  (this->ev).z = dVar1 * dVar6 - dVar5 * dVar2;
  return;
}

Assistant:

PlaneMap(Vector const& n, Vector const& e1)
        : eu( e1 - n * (n & e1) / (n & n) )
        , ev( n ^ e1 )
    {}